

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_application_filter.cpp
# Opt level: O0

vector<char,_std::allocator<char>_> *
Fossilize::read_file(vector<char,_std::allocator<char>_> *__return_storage_ptr__,char *path)

{
  undefined8 __n;
  FILE *__stream;
  char *__ptr;
  size_t sVar1;
  allocator_type local_41;
  undefined1 local_40 [8];
  vector<char,_std::allocator<char>_> buffer;
  long len;
  FILE *file;
  char *path_local;
  
  __stream = fopen(path,"rb");
  if (__stream == (FILE *)0x0) {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<char,_std::allocator<char>_>::vector(__return_storage_ptr__);
  }
  else {
    fseek(__stream,0,2);
    buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = ftell(__stream);
    if ((long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ < 0) {
      fclose(__stream);
      memset(__return_storage_ptr__,0,0x18);
      std::vector<char,_std::allocator<char>_>::vector(__return_storage_ptr__);
    }
    else {
      rewind(__stream);
      __n = buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_;
      std::allocator<char>::allocator();
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_40,__n,&local_41);
      std::allocator<char>::~allocator(&local_41);
      __ptr = std::vector<char,_std::allocator<char>_>::data
                        ((vector<char,_std::allocator<char>_> *)local_40);
      sVar1 = fread(__ptr,1,buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_,
                    __stream);
      if (sVar1 == buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_) {
        fclose(__stream);
        std::vector<char,_std::allocator<char>_>::vector
                  (__return_storage_ptr__,(vector<char,_std::allocator<char>_> *)local_40);
      }
      else {
        fclose(__stream);
        memset(__return_storage_ptr__,0,0x18);
        std::vector<char,_std::allocator<char>_>::vector(__return_storage_ptr__);
      }
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_40);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<char> read_file(const char *path)
{
	FILE *file = fopen(path, "rb");
	if (!file)
		return {};

	fseek(file, 0, SEEK_END);
	long len = ftell(file);

	if (len < 0)
	{
		fclose(file);
		return {};
	}

	rewind(file);
	std::vector<char> buffer(len);
	if (fread(buffer.data(), 1, len, file) != size_t(len))
	{
		fclose(file);
		return {};
	}

	fclose(file);
	return buffer;
}